

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

gs_val_t * gs_eval_expr(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_expr_t *expr)

{
  vec_void_t *data;
  undefined8 *puVar1;
  gs_val_type *pgVar2;
  char *pcVar3;
  char cVar4;
  gs_binary_op_type gVar5;
  gs_expr_type gVar6;
  gs_expr_t *pgVar7;
  char *pcVar8;
  map_node_t *pmVar9;
  gs_val_t val_00;
  gs_val_t left;
  gs_val_t val_01;
  gs_val_t val_02;
  gs_val_t left_00;
  gs_val_t left_01;
  gs_val_t left_02;
  gs_val_t left_03;
  gs_val_t left_04;
  gs_val_t left_05;
  gs_val_t left_06;
  gs_val_t left_07;
  gs_val_t right;
  gs_val_t right_00;
  gs_val_t right_01;
  gs_val_t right_02;
  gs_val_t right_03;
  gs_val_t right_04;
  gs_val_t right_05;
  gs_val_t right_06;
  gs_val_t right_07;
  vec2 vVar10;
  char **data_00;
  uint5 uVar11;
  vec2 vVar12;
  _Bool _Var13;
  int iVar14;
  int iVar15;
  gs_val_t *pgVar16;
  gs_val_t *pgVar17;
  map_node_t **ppmVar18;
  vec_gs_val_t *data_01;
  golf_string_t *str;
  gs_val_t *extraout_RAX;
  map_base_t *pmVar19;
  long lVar20;
  undefined8 uVar21;
  long lVar22;
  int *piVar23;
  byte bVar24;
  gs_eval_t *eval_00;
  char *pcVar25;
  map_node_t **unaff_R12;
  vec_gs_val_t *pvVar26;
  long lVar27;
  anon_union_32_11_85719a42_for_gs_expr_2 *paVar28;
  ulong uVar29;
  float fVar30;
  gs_val_type gVar31;
  undefined4 uVar32;
  gs_val_t left_val;
  gs_val_t right_val;
  gs_val_t val;
  gs_val_t right_val_1;
  undefined1 local_c8 [32];
  undefined1 local_a8 [8];
  anon_union_16_10_4eabebd3_for_gs_val_2 aStack_a0;
  gs_val_t local_88;
  gs_val_t *local_70;
  gs_val_t local_68;
  map_base_t *local_48;
  gs_eval_t *local_40;
  gs_val_t *local_38;
  
  pgVar16 = (gs_val_t *)(ulong)expr->type;
  if ((gs_val_t *)0xa < pgVar16) {
    return pgVar16;
  }
  pgVar17 = (gs_val_t *)
            ((long)&switchD_0013abb0::switchdataD_0023db00 +
            (long)(int)(&switchD_0013abb0::switchdataD_0023db00)[(long)pgVar16]);
  switch(pgVar16) {
  case (gs_val_t *)0x0:
    gs_eval_expr((gs_val_t *)local_c8,eval,(expr->field_2).binary_op.left);
    if (local_c8[4] == true) goto LAB_0013b59d;
    gs_eval_expr((gs_val_t *)local_a8,eval,(expr->field_2).binary_op.right);
    if ((_Bool)local_a8[4] == true) {
      local_88.field_2.vec3_val.z = (float)CONCAT13(aStack_a0.field10[0xb],aStack_a0._8_3_);
      local_88.field_2._12_4_ = aStack_a0._12_4_;
      local_c8._0_4_ = CONCAT13(local_a8[3],CONCAT12(local_a8[2],local_a8._0_2_));
      gVar31 = CONCAT13(local_a8[7],CONCAT21(local_a8._5_2_,1));
      local_c8._8_4_ = CONCAT13(aStack_a0.field10[3],aStack_a0.int_val._0_3_);
      local_c8._12_4_ = CONCAT13(aStack_a0.field10[7],aStack_a0._4_3_);
      goto LAB_0013b5af;
    }
    switch((expr->field_2).int_val) {
    case 0:
      right.field_2.field10[0xb] = aStack_a0.field10[0xb];
      right.field_2._8_3_ = aStack_a0._8_3_;
      right.field_2._12_4_ = aStack_a0._12_4_;
      right.type._2_1_ = local_a8[2];
      right.type._0_2_ = local_a8._0_2_;
      right.type._3_1_ = local_a8[3];
      right.is_return = (_Bool)local_a8[4];
      right._5_2_ = local_a8._5_2_;
      right._7_1_ = local_a8[7];
      right.field_2._3_4_ = aStack_a0._3_4_;
      right.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      right.field_2.field10[7] = aStack_a0.field10[7];
      left.field_2._12_4_ = local_c8._20_4_;
      left.field_2.vec3_val.z = (float)local_c8._16_4_;
      left.is_return = local_c8[4];
      left.type = local_c8._0_4_;
      left._5_2_ = local_c8._5_2_;
      left._7_1_ = local_c8[7];
      left.field_2._4_4_ = local_c8._12_4_;
      left.field_2.int_val = local_c8._8_4_;
      gs_eval_binary_op_add(&local_88,eval,left,right);
      break;
    case 1:
      right_04.field_2.field10[0xb] = aStack_a0.field10[0xb];
      right_04.field_2._8_3_ = aStack_a0._8_3_;
      right_04.field_2._12_4_ = aStack_a0._12_4_;
      right_04.type._2_1_ = local_a8[2];
      right_04.type._0_2_ = local_a8._0_2_;
      right_04.type._3_1_ = local_a8[3];
      right_04.is_return = (_Bool)local_a8[4];
      right_04._5_2_ = local_a8._5_2_;
      right_04._7_1_ = local_a8[7];
      right_04.field_2._3_4_ = aStack_a0._3_4_;
      right_04.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      right_04.field_2.field10[7] = aStack_a0.field10[7];
      left_04.field_2._12_4_ = local_c8._20_4_;
      left_04.field_2.vec3_val.z = (float)local_c8._16_4_;
      left_04.is_return = local_c8[4];
      left_04.type = local_c8._0_4_;
      left_04._5_2_ = local_c8._5_2_;
      left_04._7_1_ = local_c8[7];
      left_04.field_2._4_4_ = local_c8._12_4_;
      left_04.field_2.int_val = local_c8._8_4_;
      gs_eval_binary_op_sub(&local_88,eval,left_04,right_04);
      break;
    case 2:
      right_01.field_2.field10[0xb] = aStack_a0.field10[0xb];
      right_01.field_2._8_3_ = aStack_a0._8_3_;
      right_01.field_2._12_4_ = aStack_a0._12_4_;
      right_01.type._2_1_ = local_a8[2];
      right_01.type._0_2_ = local_a8._0_2_;
      right_01.type._3_1_ = local_a8[3];
      right_01.is_return = (_Bool)local_a8[4];
      right_01._5_2_ = local_a8._5_2_;
      right_01._7_1_ = local_a8[7];
      right_01.field_2._3_4_ = aStack_a0._3_4_;
      right_01.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      right_01.field_2.field10[7] = aStack_a0.field10[7];
      left_01.field_2._12_4_ = local_c8._20_4_;
      left_01.field_2.vec3_val.z = (float)local_c8._16_4_;
      left_01.is_return = local_c8[4];
      left_01.type = local_c8._0_4_;
      left_01._5_2_ = local_c8._5_2_;
      left_01._7_1_ = local_c8[7];
      left_01.field_2._4_4_ = local_c8._12_4_;
      left_01.field_2.int_val = local_c8._8_4_;
      gs_eval_binary_op_mul(&local_88,eval,left_01,right_01);
      break;
    case 3:
      right_02.field_2.field10[0xb] = aStack_a0.field10[0xb];
      right_02.field_2._8_3_ = aStack_a0._8_3_;
      right_02.field_2._12_4_ = aStack_a0._12_4_;
      right_02.type._2_1_ = local_a8[2];
      right_02.type._0_2_ = local_a8._0_2_;
      right_02.type._3_1_ = local_a8[3];
      right_02.is_return = (_Bool)local_a8[4];
      right_02._5_2_ = local_a8._5_2_;
      right_02._7_1_ = local_a8[7];
      right_02.field_2._3_4_ = aStack_a0._3_4_;
      right_02.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      right_02.field_2.field10[7] = aStack_a0.field10[7];
      left_02.field_2._12_4_ = local_c8._20_4_;
      left_02.field_2.vec3_val.z = (float)local_c8._16_4_;
      left_02.is_return = local_c8[4];
      left_02.type = local_c8._0_4_;
      left_02._5_2_ = local_c8._5_2_;
      left_02._7_1_ = local_c8[7];
      left_02.field_2._4_4_ = local_c8._12_4_;
      left_02.field_2.int_val = local_c8._8_4_;
      gs_eval_binary_op_div(&local_88,eval,left_02,right_02);
      break;
    case 4:
      right_00.field_2.field10[0xb] = aStack_a0.field10[0xb];
      right_00.field_2._8_3_ = aStack_a0._8_3_;
      right_00.field_2._12_4_ = aStack_a0._12_4_;
      right_00.type._2_1_ = local_a8[2];
      right_00.type._0_2_ = local_a8._0_2_;
      right_00.type._3_1_ = local_a8[3];
      right_00.is_return = (_Bool)local_a8[4];
      right_00._5_2_ = local_a8._5_2_;
      right_00._7_1_ = local_a8[7];
      right_00.field_2._3_4_ = aStack_a0._3_4_;
      right_00.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      right_00.field_2.field10[7] = aStack_a0.field10[7];
      left_00.field_2._12_4_ = local_c8._20_4_;
      left_00.field_2.vec3_val.z = (float)local_c8._16_4_;
      left_00.is_return = local_c8[4];
      left_00.type = local_c8._0_4_;
      left_00._5_2_ = local_c8._5_2_;
      left_00._7_1_ = local_c8[7];
      left_00.field_2._4_4_ = local_c8._12_4_;
      left_00.field_2.int_val = local_c8._8_4_;
      gs_eval_binary_op_lt(&local_88,eval,left_00,right_00);
      break;
    case 5:
      right_05.field_2.field10[0xb] = aStack_a0.field10[0xb];
      right_05.field_2._8_3_ = aStack_a0._8_3_;
      right_05.field_2._12_4_ = aStack_a0._12_4_;
      right_05.type._2_1_ = local_a8[2];
      right_05.type._0_2_ = local_a8._0_2_;
      right_05.type._3_1_ = local_a8[3];
      right_05.is_return = (_Bool)local_a8[4];
      right_05._5_2_ = local_a8._5_2_;
      right_05._7_1_ = local_a8[7];
      right_05.field_2._3_4_ = aStack_a0._3_4_;
      right_05.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      right_05.field_2.field10[7] = aStack_a0.field10[7];
      left_05.field_2._12_4_ = local_c8._20_4_;
      left_05.field_2.vec3_val.z = (float)local_c8._16_4_;
      left_05.is_return = local_c8[4];
      left_05.type = local_c8._0_4_;
      left_05._5_2_ = local_c8._5_2_;
      left_05._7_1_ = local_c8[7];
      left_05.field_2._4_4_ = local_c8._12_4_;
      left_05.field_2.int_val = local_c8._8_4_;
      gs_eval_binary_op_gt(&local_88,eval,left_05,right_05);
      break;
    case 6:
      right_06.field_2.field10[0xb] = aStack_a0.field10[0xb];
      right_06.field_2._8_3_ = aStack_a0._8_3_;
      right_06.field_2._12_4_ = aStack_a0._12_4_;
      right_06.type._2_1_ = local_a8[2];
      right_06.type._0_2_ = local_a8._0_2_;
      right_06.type._3_1_ = local_a8[3];
      right_06.is_return = (_Bool)local_a8[4];
      right_06._5_2_ = local_a8._5_2_;
      right_06._7_1_ = local_a8[7];
      right_06.field_2._3_4_ = aStack_a0._3_4_;
      right_06.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      right_06.field_2.field10[7] = aStack_a0.field10[7];
      left_06.field_2._12_4_ = local_c8._20_4_;
      left_06.field_2.vec3_val.z = (float)local_c8._16_4_;
      left_06.is_return = local_c8[4];
      left_06.type = local_c8._0_4_;
      left_06._5_2_ = local_c8._5_2_;
      left_06._7_1_ = local_c8[7];
      left_06.field_2._4_4_ = local_c8._12_4_;
      left_06.field_2.int_val = local_c8._8_4_;
      gs_eval_binary_op_lte(&local_88,eval,left_06,right_06);
      break;
    case 7:
      right_03.field_2.field10[0xb] = aStack_a0.field10[0xb];
      right_03.field_2._8_3_ = aStack_a0._8_3_;
      right_03.field_2._12_4_ = aStack_a0._12_4_;
      right_03.type._2_1_ = local_a8[2];
      right_03.type._0_2_ = local_a8._0_2_;
      right_03.type._3_1_ = local_a8[3];
      right_03.is_return = (_Bool)local_a8[4];
      right_03._5_2_ = local_a8._5_2_;
      right_03._7_1_ = local_a8[7];
      right_03.field_2._3_4_ = aStack_a0._3_4_;
      right_03.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      right_03.field_2.field10[7] = aStack_a0.field10[7];
      left_03.field_2._12_4_ = local_c8._20_4_;
      left_03.field_2.vec3_val.z = (float)local_c8._16_4_;
      left_03.is_return = local_c8[4];
      left_03.type = local_c8._0_4_;
      left_03._5_2_ = local_c8._5_2_;
      left_03._7_1_ = local_c8[7];
      left_03.field_2._4_4_ = local_c8._12_4_;
      left_03.field_2.int_val = local_c8._8_4_;
      gs_eval_binary_op_gte(&local_88,eval,left_03,right_03);
      break;
    case 8:
      right_07.field_2.field10[0xb] = aStack_a0.field10[0xb];
      right_07.field_2._8_3_ = aStack_a0._8_3_;
      right_07.field_2._12_4_ = aStack_a0._12_4_;
      right_07.type._2_1_ = local_a8[2];
      right_07.type._0_2_ = local_a8._0_2_;
      right_07.type._3_1_ = local_a8[3];
      right_07.is_return = (_Bool)local_a8[4];
      right_07._5_2_ = local_a8._5_2_;
      right_07._7_1_ = local_a8[7];
      right_07.field_2._3_4_ = aStack_a0._3_4_;
      right_07.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      right_07.field_2.field10[7] = aStack_a0.field10[7];
      left_07.field_2._12_4_ = local_c8._20_4_;
      left_07.field_2.vec3_val.z = (float)local_c8._16_4_;
      left_07.is_return = local_c8[4];
      left_07.type = local_c8._0_4_;
      left_07._5_2_ = local_c8._5_2_;
      left_07._7_1_ = local_c8[7];
      left_07.field_2._4_4_ = local_c8._12_4_;
      left_07.field_2.int_val = local_c8._8_4_;
      gs_eval_binary_op_eq(&local_88,eval,left_07,right_07);
      break;
    case 9:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                    ,0x416,"gs_val_t gs_eval_expr_binary_op(gs_eval_t *, gs_expr_t *)");
    }
    goto switchD_0013b201_default;
  case (gs_val_t *)0x1:
    gs_eval_expr(&local_68,eval,(expr->field_2).binary_op.left);
    _Var13 = local_68.is_return;
    if (local_68.is_return == true) {
      local_a8._0_2_ = local_68._5_2_;
      local_a8[2] = local_68._7_1_;
      local_a8[3] = (undefined1)local_68.field_2.int_val;
      local_a8[4] = (byte)((uint)local_68.field_2._0_4_ >> 8);
      local_a8._5_2_ = (undefined2)((uint)local_68.field_2._0_4_ >> 0x10);
      stack0xffffffffffffff5f = local_68.field_2.vec2_val.y;
      aStack_a0._3_4_ = local_68.field_2.vec3_val.z;
      aStack_a0._7_4_ = local_68.field_2._12_4_;
      bVar24 = local_68.is_return;
      gVar31 = local_68.type;
    }
    else {
      local_40 = (gs_eval_t *)&expr->field_2;
      paVar28 = (anon_union_32_11_85719a42_for_gs_expr_2 *)local_40;
      while( true ) {
        pgVar7 = (paVar28->assignment).left;
        gVar6 = pgVar7->type;
        if (gVar6 != GS_EXPR_MEMBER_ACCESS) break;
        paVar28 = &pgVar7->field_2;
      }
      if (gVar6 == GS_EXPR_ARRAY_ACCESS) {
        pcVar25 = (char *)eval;
        local_70 = __return_storage_ptr__;
        gs_eval_expr((gs_val_t *)local_c8,eval,(pgVar7->field_2).assignment.left);
        if (local_c8[4] == true) {
LAB_0013b257:
          local_88.field_2.vec3_val.z = (float)local_c8._16_4_;
          local_88.field_2._12_4_ = local_c8._20_4_;
          local_88.type = local_c8._0_4_;
          local_88.is_return = local_c8[4];
          local_88._5_2_ = local_c8._5_2_;
          local_88._7_1_ = local_c8[7];
          local_88.field_2.int_val = local_c8._8_4_;
          local_88.field_2.vec2_val.y = (float)local_c8._12_4_;
          __return_storage_ptr__ = local_70;
        }
        else {
          if (local_c8._0_4_ == GS_VAL_LIST) {
            gs_eval_expr((gs_val_t *)local_a8,eval,(pgVar7->field_2).binary_op.left);
            __return_storage_ptr__ = local_70;
            pcVar25 = (char *)eval;
            if ((_Bool)local_a8[4] == true) goto LAB_0013b257;
            iVar14 = CONCAT13(local_a8[3],CONCAT12(local_a8[2],local_a8._0_2_));
            if (iVar14 == 3) {
              local_88.field_2.int_val =
                   (int)(float)CONCAT13(aStack_a0.field10[3],aStack_a0.int_val._0_3_);
              local_88.type = GS_VAL_INT;
              local_88.is_return = false;
            }
            else if (iVar14 == 2) {
              local_88.type = GS_VAL_INT;
              local_88.is_return = (_Bool)local_a8[4];
              local_88._5_2_ = local_a8._5_2_;
              local_88._7_1_ = local_a8[7];
              local_88.field_2.vec2_val.y = (float)CONCAT43(aStack_a0._7_4_,aStack_a0._4_3_);
              local_88.field_2.vec3_val.z =
                   (float)(CONCAT17(aStack_a0.field10[0xb],CONCAT43(aStack_a0._7_4_,aStack_a0._4_3_)
                                   ) >> 0x20);
              local_88.field_2._12_4_ = aStack_a0._12_4_;
              local_88.field_2.int_val = CONCAT13(aStack_a0.field10[3],aStack_a0.int_val._0_3_);
            }
            else {
              pcVar25 = "Unable to perform cast";
              gs_val_error(&local_88,"Unable to perform cast");
              pcVar25 = (char *)(gs_eval_t *)pcVar25;
            }
            aStack_a0.field10[0xb] = (undefined1)((uint)local_88.field_2._8_4_ >> 0x18);
            aStack_a0._12_4_ = local_88.field_2._12_4_;
            local_a8._0_2_ = (undefined2)local_88.type;
            local_a8[2] = (undefined1)(local_88.type >> 0x10);
            local_a8[3] = (undefined1)(local_88.type >> 0x18);
            local_a8[4] = local_88.is_return;
            local_a8._5_2_ = local_88._5_2_;
            aStack_a0.int_val._0_3_ = (undefined3)local_88.field_2.int_val;
            local_a8[7] = local_88._7_1_;
            aStack_a0._4_3_ = SUB43(local_88.field_2.vec2_val.y,0);
            aStack_a0._3_4_ = CONCAT31(aStack_a0._4_3_,(char)((uint)local_88.field_2._0_4_ >> 0x18))
            ;
            aStack_a0.field10[7] = (undefined1)((uint)local_88.field_2._4_4_ >> 0x18);
            aStack_a0._7_4_ = CONCAT31(SUB43(local_88.field_2.vec3_val.z,0),aStack_a0.field10[7]);
            if (local_88.is_return == true) {
              local_88.field_2.vec3_val.z = (float)local_c8._16_4_;
              local_88.field_2._12_4_ = local_c8._20_4_;
              local_88.type = local_c8._0_4_;
              local_88.is_return = local_c8[4];
              local_88._5_2_ = local_c8._5_2_;
              local_88._7_1_ = local_c8[7];
              local_88.field_2.int_val = local_c8._8_4_;
              local_88.field_2.vec2_val.y = (float)local_c8._12_4_;
              goto LAB_0013b6a3;
            }
            lVar22 = (long)local_88.field_2.int_val;
            if (lVar22 < 0) {
              pcVar25 = "Invalid list index";
            }
            else {
              if ((uint)local_88.field_2.int_val < 0x3e81) {
                data_00 = (char **)CONCAT44(local_c8._12_4_,local_c8._8_4_);
                if (*(int *)(data_00 + 1) <= local_88.field_2.int_val) {
                  iVar14 = (local_88.field_2.int_val - *(int *)(data_00 + 1)) + 1;
                  do {
                    pcVar25 = (char *)(data_00 + 1);
                    iVar15 = vec_expand_(data_00,(int *)(data_00 + 1),(int *)((long)data_00 + 0xc),
                                         0x18,data_00[2]);
                    if (iVar15 == 0) {
                      pcVar8 = *data_00;
                      lVar27 = (long)*(int *)(data_00 + 1);
                      *(int *)(data_00 + 1) = *(int *)(data_00 + 1) + 1;
                      pcVar3 = pcVar8 + lVar27 * 0x18;
                      pcVar3[0] = '\x02';
                      pcVar3[1] = '\0';
                      pcVar3[2] = '\0';
                      pcVar3[3] = '\0';
                      pcVar8[lVar27 * 0x18 + 4] = '\0';
                      pcVar8 = pcVar8 + lVar27 * 0x18 + 8;
                      pcVar8[0] = '\0';
                      pcVar8[1] = '\0';
                      pcVar8[2] = '\0';
                      pcVar8[3] = '\0';
                    }
                    iVar14 = iVar14 + -1;
                  } while (iVar14 != 0);
                }
                ppmVar18 = (map_node_t **)(*data_00 + lVar22 * 0x18);
                goto LAB_0013b16b;
              }
              pcVar25 = "List index larger than max of 16000";
            }
          }
          else {
            pcVar25 = "Expecing type list";
          }
LAB_0013b68f:
          gs_val_error(&local_88,pcVar25);
          __return_storage_ptr__ = local_70;
        }
      }
      else {
        if (gVar6 != GS_EXPR_SYMBOL) {
          pcVar25 = "Expected lval";
          local_70 = __return_storage_ptr__;
          goto LAB_0013b68f;
        }
        uVar29 = (ulong)(uint)(eval->env).length;
        local_70 = __return_storage_ptr__;
        do {
          if ((int)uVar29 < 1) {
            pcVar25 = "Unable to find symbol %s";
            gs_val_error(&local_88,"Unable to find symbol %s",(pgVar7->field_2).symbol);
            __return_storage_ptr__ = local_70;
            goto LAB_0013b6a3;
          }
          pmVar19 = (map_base_t *)(eval->env).data[uVar29 - 1];
          uVar29 = uVar29 - 1;
          pcVar25 = (char *)(pgVar7->field_2).assignment.left;
          ppmVar18 = (map_node_t **)map_get_(pmVar19,pcVar25);
          pmVar19[1].buckets = ppmVar18;
        } while (ppmVar18 == (map_node_t **)0x0);
LAB_0013b16b:
        local_88.field_2.vec3_val.z = SUB84(ppmVar18[2],0);
        local_88.field_2._12_4_ = (undefined4)((ulong)ppmVar18[2] >> 0x20);
        pmVar9 = *ppmVar18;
        local_88.type = (gs_val_type)pmVar9;
        local_88.is_return = SUB81((ulong)pmVar9 >> 0x20,0);
        local_88._5_2_ = SUB82((ulong)pmVar9 >> 0x28,0);
        local_88._7_1_ = SUB81((ulong)pmVar9 >> 0x38,0);
        local_88.field_2.int_val = (int)ppmVar18[1];
        local_88.field_2.vec2_val.y = (float)((ulong)ppmVar18[1] >> 0x20);
        unaff_R12 = ppmVar18;
        __return_storage_ptr__ = local_70;
      }
LAB_0013b6a3:
      local_a8._0_2_ = local_88._5_2_;
      local_a8[2] = local_88._7_1_;
      local_a8[3] = local_88.field_2.bool_val;
      local_a8[4] = (byte)((uint)local_88.field_2._0_4_ >> 8);
      local_a8._5_2_ = (undefined2)((uint)local_88.field_2._0_4_ >> 0x10);
      stack0xffffffffffffff5f = local_88.field_2.vec2_val.y;
      aStack_a0._3_4_ = local_88.field_2.vec3_val.z;
      aStack_a0._7_4_ = local_88.field_2._12_4_;
      bVar24 = local_88.is_return;
      gVar31 = local_88.type;
      if ((local_88.is_return & 1U) == 0) {
        if (unaff_R12 == (map_node_t **)0x0) {
          __assert_fail("lval",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                        ,0x42a,"gs_val_t gs_eval_expr_assignment(gs_eval_t *, gs_expr_t *)");
        }
        gVar6 = (*(gs_expr_t **)&local_40->allocated_strings)->type;
        bVar24 = _Var13;
        if (gVar6 == GS_EXPR_ARRAY_ACCESS) {
LAB_0013b792:
          unaff_R12[2] = (map_node_t *)CONCAT44(local_68.field_2._12_4_,local_68.field_2.vec3_val.z)
          ;
          *unaff_R12 = (map_node_t *)
                       CONCAT17(local_68._7_1_,
                                CONCAT25(local_68._5_2_,CONCAT14(local_68.is_return,local_68.type)))
          ;
          unaff_R12[1] = (map_node_t *)
                         CONCAT44(local_68.field_2.vec2_val.y,local_68.field_2.int_val);
        }
        else if (gVar6 == GS_EXPR_MEMBER_ACCESS) {
          pcVar25 = *(char **)((long)&(*(gs_expr_t **)&local_40->allocated_strings)->field_2 + 0x18)
          ;
          if (local_68.type == GS_VAL_INT) {
            local_c8._8_4_ = (undefined4)local_68.field_2.int_val;
            local_c8._0_4_ = GS_VAL_FLOAT;
            local_c8[4] = false;
          }
          else if (local_68.type == GS_VAL_FLOAT) {
            local_c8._0_4_ = GS_VAL_FLOAT;
            local_c8[4] = local_68.is_return;
            local_c8._5_2_ = local_68._5_2_;
            local_c8[7] = local_68._7_1_;
            local_c8._8_4_ = local_68.field_2.int_val;
            local_c8._12_4_ = local_68.field_2.vec2_val.y;
            local_c8._16_4_ = local_68.field_2.vec3_val.z;
            local_c8._20_4_ = local_68.field_2._12_4_;
          }
          else {
            gs_val_error((gs_val_t *)local_c8,"Unable to perform cast");
          }
          local_68.field_2.vec3_val.z = (float)local_c8._16_4_;
          local_68.field_2._12_4_ = local_c8._20_4_;
          local_68.type = local_c8._0_4_;
          local_68.is_return = local_c8[4];
          local_68._5_2_ = local_c8._5_2_;
          local_68._7_1_ = local_c8[7];
          local_68.field_2.int_val = local_c8._8_4_;
          local_68.field_2.vec2_val.y = (float)local_c8._12_4_;
          bVar24 = local_c8[4];
          if (local_c8[4] == true) {
            local_a8._0_2_ = local_c8._5_2_;
            local_a8[2] = local_c8[7];
            local_a8[3] = (undefined1)local_c8._8_4_;
            local_a8[4] = SUB41(local_c8._8_4_,1);
            local_a8._5_2_ = SUB42(local_c8._8_4_,2);
            unique0x00011f80 = (float)local_c8._12_4_;
            aStack_a0._3_4_ = local_c8._16_4_;
            gVar31 = local_c8._0_4_;
            aStack_a0._7_4_ = local_68.field_2._12_4_;
            goto LAB_0013b7cd;
          }
          if (*(gs_val_type *)unaff_R12 == GS_VAL_VEC3) {
            cVar4 = *pcVar25;
            if (cVar4 == 'z') {
              if (pcVar25[1] == '\0') {
                *(undefined4 *)(unaff_R12 + 2) = local_c8._8_4_;
              }
              goto LAB_0013b7ae;
            }
          }
          else {
            if (*(gs_val_type *)unaff_R12 != GS_VAL_VEC2) {
              gs_val_error((gs_val_t *)local_c8,"Unable to perform member access on type");
              local_a8._0_2_ = local_c8._5_2_;
              local_a8[2] = local_c8[7];
              local_a8[3] = (undefined1)local_c8._8_4_;
              local_a8[4] = SUB41(local_c8._8_4_,1);
              local_a8._5_2_ = SUB42(local_c8._8_4_,2);
              stack0xffffffffffffff5f = (float)local_c8._12_4_;
              aStack_a0._3_4_ = local_c8._16_4_;
              bVar24 = local_c8[4];
              gVar31 = local_c8._0_4_;
              aStack_a0._7_4_ = local_c8._20_4_;
              goto LAB_0013b7cd;
            }
            cVar4 = *pcVar25;
          }
          if (cVar4 == 'y') {
            if (pcVar25[1] == '\0') {
              *(undefined4 *)((long)unaff_R12 + 0xc) = local_c8._8_4_;
            }
          }
          else if ((cVar4 == 'x') && (pcVar25[1] == '\0')) {
            *(undefined4 *)(unaff_R12 + 1) = local_c8._8_4_;
          }
        }
        else {
          val_02.field_2._12_4_ = local_68.field_2._12_4_;
          val_02.field_2.vec3_val.z = local_68.field_2.vec3_val.z;
          val_02.is_return = local_68.is_return;
          val_02.type = local_68.type;
          val_02._5_2_ = local_68._5_2_;
          val_02._7_1_ = local_68._7_1_;
          val_02.field_2.vec2_val.y = local_68.field_2.vec2_val.y;
          val_02.field_2.int_val = local_68.field_2.int_val;
          gs_eval_cast((gs_val_t *)local_c8,(gs_eval_t *)pcVar25,val_02,*(gs_val_type *)unaff_R12);
          local_68.field_2.vec3_val.z = (float)local_c8._16_4_;
          local_68.field_2._12_4_ = local_c8._20_4_;
          local_68.type = local_c8._0_4_;
          local_68.is_return = local_c8[4];
          local_68._5_2_ = local_c8._5_2_;
          local_68._7_1_ = local_c8[7];
          local_68.field_2.int_val = local_c8._8_4_;
          local_68.field_2.vec2_val.y = (float)local_c8._12_4_;
          bVar24 = local_c8[4];
          if (local_c8[4] != true) goto LAB_0013b792;
        }
LAB_0013b7ae:
        local_a8._0_2_ = local_68._5_2_;
        local_a8[2] = local_68._7_1_;
        local_a8[3] = (undefined1)local_68.field_2.int_val;
        local_a8[4] = (byte)((uint)local_68.field_2._0_4_ >> 8);
        local_a8._5_2_ = (undefined2)((uint)local_68.field_2._0_4_ >> 0x10);
        stack0xffffffffffffff5f = local_68.field_2.vec2_val.y;
        aStack_a0._3_4_ = local_68.field_2.vec3_val.z;
        gVar31 = local_68.type;
        aStack_a0._7_4_ = local_68.field_2._12_4_;
      }
    }
LAB_0013b7cd:
    __return_storage_ptr__->type = gVar31;
    __return_storage_ptr__->is_return = (_Bool)bVar24;
    *(undefined2 *)&__return_storage_ptr__->field_0x5 = local_a8._0_2_;
    __return_storage_ptr__->field_0x7 = local_a8[2];
    (__return_storage_ptr__->field_2).int_val =
         CONCAT22(local_a8._5_2_,CONCAT11(local_a8[4],local_a8[3]));
    (__return_storage_ptr__->field_2).vec2_val.y = stack0xffffffffffffff5f;
    (__return_storage_ptr__->field_2).vec3_val.z = (float)aStack_a0._3_4_;
    (__return_storage_ptr__->field_2).field10[0xc] = aStack_a0.field10[7];
    pgVar17 = (gs_val_t *)(ulong)(uint)aStack_a0._7_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 0xc) = aStack_a0._7_4_;
    break;
  case (gs_val_t *)0x2:
    gVar5 = (expr->field_2).binary_op.type;
    pgVar17 = (gs_val_t *)(ulong)gVar5;
    __return_storage_ptr__->type = GS_VAL_INT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).int_val = gVar5;
    break;
  case (gs_val_t *)0x3:
    iVar14 = (expr->field_2).int_val;
    __return_storage_ptr__->type = GS_VAL_FLOAT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).int_val = iVar14;
    break;
  case (gs_val_t *)0x4:
    uVar29 = (ulong)(uint)(eval->env).length;
    do {
      if ((int)uVar29 < 1) {
        gs_val_error((gs_val_t *)local_c8,"Could not find symbol %s",(expr->field_2).symbol);
        goto LAB_0013b0eb;
      }
      pmVar19 = (map_base_t *)(eval->env).data[uVar29 - 1];
      uVar29 = uVar29 - 1;
      ppmVar18 = (map_node_t **)map_get_(pmVar19,(expr->field_2).symbol);
      pmVar19[1].buckets = ppmVar18;
    } while (ppmVar18 == (map_node_t **)0x0);
    local_c8._16_4_ = SUB84(ppmVar18[2],0);
    local_c8._20_4_ = (undefined4)((ulong)ppmVar18[2] >> 0x20);
    pmVar9 = *ppmVar18;
    local_c8._0_4_ = SUB84(pmVar9,0);
    local_c8[4] = SUB81((ulong)pmVar9 >> 0x20,0);
    local_c8._5_2_ = (undefined2)((ulong)pmVar9 >> 0x28);
    local_c8[7] = (undefined1)((ulong)pmVar9 >> 0x38);
    local_c8._8_4_ = SUB84(ppmVar18[1],0);
    local_c8._12_4_ = (undefined4)((ulong)ppmVar18[1] >> 0x20);
LAB_0013b0eb:
    pgVar17 = (gs_val_t *)CONCAT44(local_c8._20_4_,local_c8._16_4_);
    *(gs_val_t **)((long)&__return_storage_ptr__->field_2 + 8) = pgVar17;
    uVar32 = CONCAT13(local_c8[7],CONCAT21(local_c8._5_2_,local_c8[4]));
    local_88.type = local_c8._0_4_;
    local_88.field_2.int_val = local_c8._8_4_;
    local_88.field_2.vec2_val.y = (float)local_c8._12_4_;
    goto LAB_0013b87f;
  case (gs_val_t *)0x5:
    str = (golf_string_t *)golf_alloc_tracked(0x18,"script/eval");
    iVar14 = vec_expand_((char **)eval,&(eval->allocated_strings).length,
                         &(eval->allocated_strings).capacity,8,
                         (eval->allocated_strings).alloc_category);
    if (iVar14 == 0) {
      iVar14 = (eval->allocated_strings).length;
      (eval->allocated_strings).length = iVar14 + 1;
      (eval->allocated_strings).data[iVar14] = str;
    }
    golf_string_init(str,"script/eval",(expr->field_2).symbol);
    __return_storage_ptr__->type = GS_VAL_STRING;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).string_val = str;
    pgVar17 = extraout_RAX;
    break;
  case (gs_val_t *)0x6:
    pmVar19 = (map_base_t *)
              golf_alloc_tracked(0x38,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                                );
    (((map_gs_val_t *)&pmVar19->buckets)->base).buckets = (map_node_t **)0x0;
    pmVar19->nbuckets = 0;
    pmVar19->nnodes = 0;
    pmVar19[1].buckets = (map_node_t **)0x0;
    pmVar19[1].nbuckets = GS_VAL_VOID;
    *(_Bool *)&pmVar19[1].nnodes = false;
    *(undefined3 *)((long)&pmVar19[1].nnodes + 1) = 0;
    ((anon_union_16_10_4eabebd3_for_gs_val_2 *)&pmVar19[2].buckets)->list_val = (vec_gs_val_t *)0x0;
    pmVar19[2].nbuckets = 0;
    pmVar19[2].nnodes = 0;
    pmVar19[3].buckets = (map_node_t **)"script/eval";
    local_c8._0_4_ = GS_VAL_VOID;
    local_c8[4] = false;
    local_c8._5_2_ = 0;
    local_c8[7] = 0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0.0;
    local_c8._16_4_ = 3.293264e-39;
    local_c8._20_4_ = 0;
    gs_eval_expr(&local_68,eval,(expr->field_2).assignment.left);
    if (local_68.is_return == false) {
      if (local_68.type == GS_VAL_FN) {
        lVar22 = CONCAT44(local_68.field_2.vec2_val.y,local_68.field_2.int_val);
        iVar14 = (expr->field_2).call.num_args;
        if (iVar14 == *(int *)(lVar22 + 0x28)) {
          local_70 = __return_storage_ptr__;
          local_48 = pmVar19;
          local_40 = (gs_eval_t *)expr;
          if (0 < iVar14) {
            local_38 = (gs_val_t *)&pmVar19[1].nbuckets;
            lVar20 = 2;
            lVar27 = 0;
            do {
              pcVar25 = *(char **)(*(long *)(lVar22 + 0x38) + lVar20 * 8);
              gVar31 = *(gs_val_type *)(*(long *)(lVar22 + 0x30) + lVar27 * 4);
              eval_00 = eval;
              gs_eval_expr((gs_val_t *)local_a8,eval,
                           *(gs_expr_t **)
                            (&((((anon_union_32_11_85719a42_for_gs_expr_2 *)((long)local_40 + 0x20))
                               ->binary_op).right)->type + lVar27 * 2));
              if ((_Bool)local_a8[4] != false) {
LAB_0013b827:
                local_68.field_2.vec3_val.z =
                     (float)CONCAT13(aStack_a0.field10[0xb],aStack_a0._8_3_);
                local_68.type = CONCAT13(local_a8[3],CONCAT12(local_a8[2],local_a8._0_2_));
                uVar32 = CONCAT13(local_a8[7],CONCAT21(local_a8._5_2_,local_a8[4]));
                local_68.field_2.int_val = CONCAT13(aStack_a0.field10[3],aStack_a0.int_val._0_3_);
                local_68.field_2.vec2_val.y = (float)CONCAT13(aStack_a0.field10[7],aStack_a0._4_3_);
                goto LAB_0013b839;
              }
              val_01.field_2.field10[0xb] = aStack_a0.field10[0xb];
              val_01.field_2._8_3_ = aStack_a0._8_3_;
              val_01.field_2._12_4_ = aStack_a0._12_4_;
              val_01.type._2_1_ = local_a8[2];
              val_01.type._0_2_ = local_a8._0_2_;
              val_01.type._3_1_ = local_a8[3];
              val_01.is_return = false;
              val_01._5_2_ = local_a8._5_2_;
              val_01._7_1_ = local_a8[7];
              val_01.field_2._3_4_ = aStack_a0._3_4_;
              val_01.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
              val_01.field_2.field10[7] = aStack_a0.field10[7];
              gs_eval_cast(&local_88,eval_00,val_01,gVar31);
              aStack_a0.field10[0xb] = (undefined1)((uint)local_88.field_2._8_4_ >> 0x18);
              aStack_a0._12_4_ = local_88.field_2._12_4_;
              local_a8._0_2_ = (undefined2)local_88.type;
              local_a8[2] = (undefined1)(local_88.type >> 0x10);
              local_a8[3] = (undefined1)(local_88.type >> 0x18);
              local_a8[4] = local_88.is_return;
              local_a8._5_2_ = local_88._5_2_;
              aStack_a0.int_val._0_3_ = (undefined3)local_88.field_2.int_val;
              local_a8[7] = local_88._7_1_;
              aStack_a0._3_4_ =
                   (undefined4)
                   (CONCAT44(local_88.field_2.vec2_val.y,local_88.field_2.int_val) >> 0x18);
              aStack_a0.field10[7] = (undefined1)((uint)local_88.field_2._4_4_ >> 0x18);
              aStack_a0._7_4_ = CONCAT31(SUB43(local_88.field_2.vec3_val.z,0),aStack_a0.field10[7]);
              if (local_88.is_return != false) goto LAB_0013b827;
              *(ulong *)((long)&local_38->field_2 + 8) =
                   CONCAT44(local_88.field_2._12_4_,local_88.field_2.vec3_val.z);
              uVar11 = (uint5)local_88.type;
              vVar12._3_4_ = aStack_a0._3_4_;
              vVar12.x._0_3_ = aStack_a0.int_val._0_3_;
              vVar12.y._3_1_ = aStack_a0.field10[7];
              local_38->type = (int)uVar11;
              local_38->is_return = (_Bool)(char)(uVar11 >> 0x20);
              *(int3 *)&local_38->field_0x5 =
                   (int3)(CONCAT17(local_88._7_1_,CONCAT25(local_88._5_2_,uVar11)) >> 0x28);
              (local_38->field_2).vec2_val = vVar12;
              map_set_(local_48,pcVar25,local_38,0x18,(char *)local_48[3].buckets);
              lVar27 = lVar27 + 1;
              lVar20 = lVar20 + 3;
            } while (lVar27 < *(int *)(lVar22 + 0x28));
          }
          piVar23 = &(eval->env).length;
          iVar14 = vec_expand_((char **)&eval->env,piVar23,&(eval->env).capacity,8,
                               (eval->env).alloc_category);
          pmVar19 = local_48;
          if (iVar14 == 0) {
            iVar14 = *piVar23;
            *piVar23 = iVar14 + 1;
            (eval->env).data[iVar14] = (gs_env_t *)local_48;
          }
          gs_eval_stmt(&local_68,eval,*(gs_stmt_t **)(lVar22 + 0x40));
          if (local_68.type != GS_VAL_ERROR) {
            local_68.is_return = false;
          }
          *piVar23 = *piVar23 + -1;
          __return_storage_ptr__ = local_70;
          goto LAB_0013b851;
        }
        pcVar25 = "Wrong number of args passed to function call";
      }
      else {
        if (local_68.type == GS_VAL_C_FN) {
          if (0 < (expr->field_2).call.num_args) {
            lVar22 = 0;
            local_70 = __return_storage_ptr__;
            local_48 = pmVar19;
LAB_0013af54:
            gs_eval_expr((gs_val_t *)local_a8,eval,
                         *(gs_expr_t **)(&((expr->field_2).binary_op.right)->type + lVar22 * 2));
            if ((_Bool)local_a8[4] == false) goto code_r0x0013af75;
            local_68.field_2.vec3_val.z = (float)CONCAT13(aStack_a0.field10[0xb],aStack_a0._8_3_);
            local_68.type = CONCAT13(local_a8[3],CONCAT12(local_a8[2],local_a8._0_2_));
            uVar32 = CONCAT13(local_a8[7],CONCAT21(local_a8._5_2_,local_a8[4]));
            local_68.field_2.int_val = CONCAT13(aStack_a0.field10[3],aStack_a0.int_val._0_3_);
            local_68.field_2.vec2_val.y = (float)CONCAT13(aStack_a0.field10[7],aStack_a0._4_3_);
LAB_0013b839:
            local_68.is_return = SUB41(uVar32,0);
            local_68._5_2_ = SUB42((uint)uVar32 >> 8,0);
            local_68._7_1_ = SUB41((uint)uVar32 >> 0x18,0);
            pmVar19 = local_48;
            __return_storage_ptr__ = local_70;
            local_68.field_2._12_4_ = aStack_a0._12_4_;
            goto LAB_0013b851;
          }
          iVar14 = 0;
          uVar21 = 0;
          goto LAB_0013b60b;
        }
        pcVar25 = "Expected a function when evaling call expr";
      }
      gs_val_error(&local_68,pcVar25);
    }
    goto LAB_0013b851;
  case (gs_val_t *)0x7:
    gs_eval_expr((gs_val_t *)local_c8,eval,(expr->field_2).assignment.left);
    if (local_c8[4] == false) {
      pcVar25 = *(char **)((long)&expr->field_2 + 0x18);
      if (local_c8._0_4_ == GS_VAL_LIST) {
        iVar14 = strcmp(pcVar25,"length");
        if (iVar14 == 0) {
          local_c8._8_4_ = *(float *)(CONCAT44(local_c8._12_4_,local_c8._8_4_) + 8);
          local_c8._0_4_ = GS_VAL_INT;
          local_c8[4] = false;
          goto LAB_0013b8c4;
        }
        pcVar25 = "Invalid member for list";
      }
      else {
        fVar30 = (float)local_c8._12_4_;
        if (local_c8._0_4_ != GS_VAL_VEC3) {
          if (local_c8._0_4_ != GS_VAL_VEC2) {
            pcVar25 = "Invalid type for member access";
            goto LAB_0013b8b8;
          }
          if (*pcVar25 != 'y') {
            if ((*pcVar25 == 'x') && (pcVar25[1] == '\0')) goto LAB_0013b43b;
LAB_0013b81b:
            pcVar25 = "Invalid member for vec2";
            goto LAB_0013b8b8;
          }
          if (pcVar25[1] != '\0') goto LAB_0013b81b;
LAB_0013bc15:
          local_c8._0_4_ = GS_VAL_FLOAT;
          local_c8[4] = false;
          local_c8._8_4_ = fVar30;
          goto LAB_0013b8c4;
        }
        cVar4 = *pcVar25;
        if (cVar4 == 'z') {
          cVar4 = pcVar25[1];
          fVar30 = (float)local_c8._16_4_;
joined_r0x0013b8ab:
          if (cVar4 == '\0') goto LAB_0013bc15;
        }
        else {
          if (cVar4 == 'y') {
            cVar4 = pcVar25[1];
            goto joined_r0x0013b8ab;
          }
          if ((cVar4 == 'x') && (pcVar25[1] == '\0')) {
LAB_0013b43b:
            local_c8._0_4_ = GS_VAL_FLOAT;
            local_c8[4] = false;
            goto LAB_0013b8c4;
          }
        }
        pcVar25 = "Invalid member for vec3";
      }
LAB_0013b8b8:
      gs_val_error((gs_val_t *)local_c8,pcVar25);
    }
LAB_0013b8c4:
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(local_c8._20_4_,local_c8._16_4_);
    __return_storage_ptr__->type = local_c8._0_4_;
    __return_storage_ptr__->is_return = local_c8[4];
    *(undefined2 *)&__return_storage_ptr__->field_0x5 = local_c8._5_2_;
    __return_storage_ptr__->field_0x7 = local_c8[7];
    (__return_storage_ptr__->field_2).int_val = local_c8._8_4_;
    pgVar17 = (gs_val_t *)(ulong)(uint)local_c8._12_4_;
    (__return_storage_ptr__->field_2).vec2_val.y = (float)local_c8._12_4_;
    break;
  case (gs_val_t *)0x8:
    gs_eval_expr((gs_val_t *)local_c8,eval,(expr->field_2).assignment.left);
    if ((local_c8[4] != true) &&
       (gs_eval_expr((gs_val_t *)local_a8,eval,(expr->field_2).binary_op.left),
       (_Bool)local_a8[4] != true)) {
      iVar14 = CONCAT13(local_a8[3],CONCAT12(local_a8[2],local_a8._0_2_));
      if (iVar14 == 3) {
        local_88.field_2.int_val =
             (int)(float)CONCAT13(aStack_a0.field10[3],aStack_a0.int_val._0_3_);
        local_88.type = GS_VAL_INT;
        local_88.is_return = false;
      }
      else if (iVar14 == 2) {
        local_88.type = GS_VAL_INT;
        local_88.is_return = (_Bool)local_a8[4];
        local_88._5_2_ = local_a8._5_2_;
        local_88._7_1_ = local_a8[7];
        local_88.field_2.vec2_val.y = (float)CONCAT43(aStack_a0._7_4_,aStack_a0._4_3_);
        local_88.field_2.vec3_val.z =
             (float)(CONCAT17(aStack_a0.field10[0xb],CONCAT43(aStack_a0._7_4_,aStack_a0._4_3_)) >>
                    0x20);
        local_88.field_2._12_4_ = aStack_a0._12_4_;
        local_88.field_2.int_val = CONCAT13(aStack_a0.field10[3],aStack_a0.int_val._0_3_);
      }
      else {
        gs_val_error(&local_88,"Unable to perform cast");
      }
      aStack_a0.field10[0xb] = (undefined1)((uint)local_88.field_2._8_4_ >> 0x18);
      aStack_a0._12_4_ = local_88.field_2._12_4_;
      local_a8._0_2_ = (undefined2)local_88.type;
      local_a8[2] = (undefined1)(local_88.type >> 0x10);
      local_a8[3] = (undefined1)(local_88.type >> 0x18);
      local_a8[4] = local_88.is_return;
      local_a8._5_2_ = local_88._5_2_;
      aStack_a0.int_val._0_3_ = (undefined3)local_88.field_2.int_val;
      local_a8[7] = local_88._7_1_;
      aStack_a0._4_3_ = SUB43(local_88.field_2.vec2_val.y,0);
      aStack_a0._3_4_ = CONCAT31(aStack_a0._4_3_,(char)((uint)local_88.field_2._0_4_ >> 0x18));
      aStack_a0.field10[7] = (undefined1)((uint)local_88.field_2._4_4_ >> 0x18);
      aStack_a0._7_4_ = CONCAT31(SUB43(local_88.field_2.vec3_val.z,0),aStack_a0.field10[7]);
      if (local_88.is_return != true) {
        if (local_c8._0_4_ == GS_VAL_LIST) {
          lVar22 = (long)local_88.field_2.int_val;
          if ((-1 < lVar22) &&
             (local_88.field_2.int_val < (int)((long *)CONCAT44(local_c8._12_4_,local_c8._8_4_))[1])
             ) {
            lVar27 = *(long *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
            uVar21 = *(undefined8 *)(lVar27 + 0x10 + lVar22 * 0x18);
            local_88.field_2.vec3_val.z = (float)uVar21;
            local_88.field_2._12_4_ = (undefined4)((ulong)uVar21 >> 0x20);
            pgVar2 = (gs_val_type *)(lVar27 + lVar22 * 0x18);
            local_c8._0_4_ = *pgVar2;
            gVar31 = pgVar2[1];
            local_c8._8_4_ = pgVar2[2];
            local_c8._12_4_ = pgVar2[3];
            goto LAB_0013b5af;
          }
          pcVar25 = "Invalid list index";
        }
        else {
          pcVar25 = "Expected type list";
        }
        gs_val_error(&local_88,pcVar25);
        goto switchD_0013b201_default;
      }
    }
LAB_0013b59d:
    local_88.field_2.vec3_val.z = (float)local_c8._16_4_;
    local_88.field_2._12_4_ = local_c8._20_4_;
    gVar31 = CONCAT13(local_c8[7],CONCAT21(local_c8._5_2_,local_c8[4]));
LAB_0013b5af:
    local_88.is_return = SUB41(gVar31,0);
    local_88._5_2_ = SUB42(gVar31 >> 8,0);
    local_88._7_1_ = SUB41(gVar31 >> 0x18,0);
    local_88.type = local_c8._0_4_;
    local_88.field_2.int_val = local_c8._8_4_;
    local_88.field_2.vec2_val.y = (float)local_c8._12_4_;
switchD_0013b201_default:
    pgVar17 = (gs_val_t *)CONCAT44(local_88.field_2._12_4_,local_88.field_2.vec3_val.z);
    *(gs_val_t **)((long)&__return_storage_ptr__->field_2 + 8) = pgVar17;
    uVar32 = CONCAT13(local_88._7_1_,CONCAT21(local_88._5_2_,local_88.is_return));
    goto LAB_0013b87f;
  case (gs_val_t *)0x9:
    local_70 = __return_storage_ptr__;
    local_40 = eval;
    data_01 = (vec_gs_val_t *)golf_alloc_tracked(0x18,"script/eval");
    data_01->data = (gs_val_t *)0x0;
    data_01->length = 0;
    data_01->capacity = 0;
    data_01->alloc_category = "script/eval";
    if (0 < (expr->field_2).int_val) {
      lVar22 = 0;
      do {
        gs_eval_expr((gs_val_t *)local_c8,local_40,
                     *(gs_expr_t **)(&((expr->field_2).binary_op.left)->type + lVar22 * 2));
        if (local_c8[4] != false) {
          local_a8._0_2_ = local_c8._5_2_;
          local_a8[2] = local_c8[7];
          pvVar26 = (vec_gs_val_t *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
          piVar23 = (int *)CONCAT44(local_c8._20_4_,local_c8._16_4_);
          golf_free_tracked(data_01->data);
          golf_free_tracked(data_01);
          goto LAB_0013b1bb;
        }
        iVar14 = vec_expand_((char **)data_01,&data_01->length,&data_01->capacity,0x18,
                             data_01->alloc_category);
        if (iVar14 == 0) {
          pgVar16 = data_01->data;
          iVar14 = data_01->length;
          data_01->length = iVar14 + 1;
          *(ulong *)((long)&pgVar16[iVar14].field_2 + 8) = CONCAT44(local_c8._20_4_,local_c8._16_4_)
          ;
          vVar10.y = (float)local_c8._12_4_;
          vVar10.x = (float)local_c8._8_4_;
          pgVar16 = pgVar16 + iVar14;
          pgVar16->type = local_c8._0_4_;
          pgVar16->is_return = local_c8[4];
          *(int3 *)&pgVar16->field_0x5 =
               (int3)(CONCAT17(local_c8[7],
                               CONCAT25(local_c8._5_2_,CONCAT14(local_c8[4],local_c8._0_4_))) >>
                     0x28);
          (pgVar16->field_2).vec2_val = vVar10;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < (expr->field_2).int_val);
    }
    data = &local_40->allocated_lists;
    piVar23 = &(local_40->allocated_lists).length;
    iVar14 = vec_expand_((char **)data,piVar23,&(local_40->allocated_lists).capacity,8,
                         (local_40->allocated_lists).alloc_category);
    local_c8._0_4_ = GS_VAL_LIST;
    if (iVar14 == 0) {
      iVar14 = *piVar23;
      *piVar23 = iVar14 + 1;
      data->data[iVar14] = data_01;
    }
    local_c8[4] = false;
    pvVar26 = data_01;
LAB_0013b1bb:
    local_70->type = local_c8._0_4_;
    local_70->is_return = local_c8[4];
    *(undefined2 *)&local_70->field_0x5 = local_a8._0_2_;
    pgVar17 = (gs_val_t *)(ulong)CONCAT11(SUB21(local_a8._0_2_,1),local_a8[2]);
    local_70->field_0x7 = local_a8[2];
    (local_70->field_2).list_val = pvVar26;
    *(int **)((long)&local_70->field_2 + 8) = piVar23;
    break;
  case (gs_val_t *)0xa:
    gs_eval_expr((gs_val_t *)local_a8,eval,(expr->field_2).binary_op.left);
    if ((_Bool)local_a8[4] == false) {
      val_00.field_2.field10[0xb] = aStack_a0.field10[0xb];
      val_00.field_2._8_3_ = aStack_a0._8_3_;
      val_00.field_2._12_4_ = aStack_a0._12_4_;
      val_00.type._2_1_ = local_a8[2];
      val_00.type._0_2_ = local_a8._0_2_;
      val_00.type._3_1_ = local_a8[3];
      val_00.is_return = false;
      val_00._5_2_ = local_a8._5_2_;
      val_00._7_1_ = local_a8[7];
      val_00.field_2._3_4_ = aStack_a0._3_4_;
      val_00.field_2.int_val._0_3_ = aStack_a0.int_val._0_3_;
      val_00.field_2.field10[7] = aStack_a0.field10[7];
      gs_eval_cast((gs_val_t *)local_c8,eval,val_00,(expr->field_2).cast.type);
      aStack_a0.field10[0xb] = SUB41(local_c8._16_4_,3);
      aStack_a0._12_4_ = local_c8._20_4_;
      local_a8._0_2_ = (undefined2)local_c8._0_4_;
      local_a8[2] = SUB41(local_c8._0_4_,2);
      local_a8[3] = SUB41(local_c8._0_4_,3);
      local_a8[4] = local_c8[4];
      local_a8._5_2_ = local_c8._5_2_;
      aStack_a0.int_val._0_3_ = (undefined3)local_c8._8_4_;
      local_a8[7] = local_c8[7];
      aStack_a0._3_4_ = (undefined4)(CONCAT44(local_c8._12_4_,local_c8._8_4_) >> 0x18);
      aStack_a0.field10[7] = SUB41(local_c8._12_4_,3);
      aStack_a0._7_4_ = CONCAT31((int3)local_c8._16_4_,aStack_a0.field10[7]);
    }
    pgVar17 = (gs_val_t *)
              CONCAT44(aStack_a0._12_4_,CONCAT13(aStack_a0.field10[0xb],aStack_a0._8_3_));
    *(gs_val_t **)((long)&__return_storage_ptr__->field_2 + 8) = pgVar17;
    local_88.type = CONCAT13(local_a8[3],CONCAT12(local_a8[2],local_a8._0_2_));
    uVar32 = CONCAT13(local_a8[7],CONCAT21(local_a8._5_2_,local_a8[4]));
    local_88.field_2.int_val = CONCAT13(aStack_a0.field10[3],aStack_a0.int_val._0_3_);
    local_88.field_2.vec2_val.y = (float)CONCAT13(aStack_a0.field10[7],aStack_a0._4_3_);
LAB_0013b87f:
    __return_storage_ptr__->type = local_88.type;
    *(undefined4 *)&__return_storage_ptr__->is_return = uVar32;
    (__return_storage_ptr__->field_2).int_val = local_88.field_2.int_val;
    (__return_storage_ptr__->field_2).vec2_val.y = local_88.field_2.vec2_val.y;
  }
  return pgVar17;
code_r0x0013af75:
  iVar14 = vec_expand_((char **)local_c8,&(((gs_val_t *)local_c8)->field_2).int_val,
                       (int *)&(((gs_val_t *)local_c8)->field_2).vec2_val.y,0x18,
                       (char *)CONCAT44(local_c8._20_4_,local_c8._16_4_));
  if (iVar14 == 0) {
    lVar27 = CONCAT17(local_c8[7],CONCAT25(local_c8._5_2_,CONCAT14(local_c8[4],local_c8._0_4_)));
    lVar20 = (long)(int)local_c8._8_4_;
    local_c8._8_4_ = local_c8._8_4_ + 1;
    *(ulong *)(lVar27 + 0x10 + lVar20 * 0x18) =
         CONCAT44(aStack_a0._12_4_,CONCAT13(aStack_a0.field10[0xb],aStack_a0._8_3_));
    puVar1 = (undefined8 *)(lVar27 + lVar20 * 0x18);
    *puVar1 = CONCAT17(local_a8[7],
                       CONCAT25(local_a8._5_2_,
                                CONCAT14(local_a8[4],
                                         CONCAT13(local_a8[3],CONCAT12(local_a8[2],local_a8._0_2_)))
                               ));
    puVar1[1] = CONCAT17(aStack_a0.field10[7],CONCAT43(aStack_a0._3_4_,aStack_a0.int_val._0_3_));
  }
  lVar22 = lVar22 + 1;
  if ((expr->field_2).call.num_args <= lVar22) goto code_r0x0013afca;
  goto LAB_0013af54;
code_r0x0013afca:
  uVar21 = CONCAT17(local_c8[7],CONCAT25(local_c8._5_2_,CONCAT14(local_c8[4],local_c8._0_4_)));
  pmVar19 = local_48;
  __return_storage_ptr__ = local_70;
  iVar14 = local_c8._8_4_;
LAB_0013b60b:
  (*(code *)CONCAT44(local_68.field_2.vec2_val.y,local_68.field_2.int_val))
            (&local_68,eval,uVar21,iVar14);
  if (local_68.type != GS_VAL_ERROR) {
    local_68.is_return = false;
  }
LAB_0013b851:
  map_deinit_(pmVar19);
  golf_free_tracked(pmVar19);
  golf_free_tracked((void *)CONCAT17(local_c8[7],
                                     CONCAT25(local_c8._5_2_,CONCAT14(local_c8[4],local_c8._0_4_))))
  ;
  pgVar17 = (gs_val_t *)CONCAT44(local_68.field_2._12_4_,local_68.field_2.vec3_val.z);
  *(gs_val_t **)((long)&__return_storage_ptr__->field_2 + 8) = pgVar17;
  uVar32 = CONCAT13(local_68._7_1_,CONCAT21(local_68._5_2_,local_68.is_return));
  local_88.type = local_68.type;
  local_88.field_2.int_val = local_68.field_2.int_val;
  local_88.field_2.vec2_val.y = local_68.field_2.vec2_val.y;
  goto LAB_0013b87f;
}

Assistant:

static gs_val_t gs_eval_expr(gs_eval_t *eval, gs_expr_t *expr) {
    gs_val_t val;
    switch (expr->type) {
        case GS_EXPR_BINARY_OP:
            val = gs_eval_expr_binary_op(eval, expr);
            break;
        case GS_EXPR_ASSIGNMENT:
            val = gs_eval_expr_assignment(eval, expr);
            break;
        case GS_EXPR_INT:
            val = gs_eval_expr_int(eval, expr);
            break;
        case GS_EXPR_FLOAT:
            val = gs_eval_expr_float(eval, expr);
            break;
        case GS_EXPR_SYMBOL:
            val = gs_eval_expr_symbol(eval, expr);
            break;
        case GS_EXPR_STRING:
            val = gs_eval_expr_string(eval, expr);
            break;
        case GS_EXPR_CALL:
            val = gs_eval_expr_call(eval, expr);
            break;
        case GS_EXPR_MEMBER_ACCESS:
            val = gs_eval_expr_member_access(eval, expr);
            break;
        case GS_EXPR_ARRAY_ACCESS:
            val = gs_eval_expr_array_access(eval, expr);
            break;
        case GS_EXPR_ARRAY_DECL:
            val = gs_eval_expr_array_decl(eval, expr);
            break;
        case GS_EXPR_CAST:
            val = gs_eval_expr_cast(eval, expr);
            break;
    }
    return val;
}